

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  bool bVar1;
  basic_appender<char> bVar2;
  size_t sVar3;
  size_t size;
  ulong uVar4;
  buffer<char> *buf;
  unsigned_long uVar5;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_18;
  
  size = 2;
  uVar5 = value;
  do {
    sVar3 = size;
    size = sVar3 + 1;
    bVar1 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar1);
  local_18.num_digits = (int)sVar3 + -1;
  local_18.value = value;
  if (specs == (format_specs *)0x0) {
    uVar4 = size + (out.container)->size_;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    bVar2 = write_ptr<char,_fmt::v11::basic_appender<char>,_unsigned_long>::anon_class_16_2_92d121e5
            ::operator()(&local_18,out.container);
  }
  else {
    bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,size,size,&local_18);
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}